

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::PipelineApiCase::iterate(PipelineApiCase *this)

{
  glProgramParameteriFunc p_Var1;
  glLinkProgramFunc p_Var2;
  glGetProgramivFunc p_Var3;
  glActiveShaderProgramFunc p_Var4;
  glUseProgramStagesFunc p_Var5;
  undefined4 uVar6;
  GLboolean GVar7;
  int iVar8;
  deUint32 dVar9;
  GLenum GVar10;
  deUint32 dVar11;
  TestLog *this_00;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  MessageBuilder *this_01;
  char *pcVar13;
  TestError *pTVar14;
  GLSLVersion glslVersion;
  GLSLVersion glslVersion_00;
  int local_470;
  GLuint local_46c;
  int separable;
  GLuint programSep;
  int i_2;
  int i_1;
  int i;
  allocator<char> local_431;
  string local_430;
  ProgramSources local_410;
  undefined1 local_340 [8];
  ShaderProgram progVF;
  string local_f0;
  string local_c0;
  deUint32 local_a0;
  int local_9c;
  GLuint value;
  GLint linkStatus;
  string frag;
  string vtx;
  GLuint pipelines [10];
  int maxpipelines;
  GLenum err;
  Functions *gl;
  TestLog *log;
  PipelineApiCase *this_local;
  Functions *gl_00;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar8 = (*pRVar12->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar8);
  std::__cxx11::string::string((string *)(frag.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&value);
  generateBasicVertexSrc_abi_cxx11_(&local_c0,(glcts *)(ulong)this->m_glslVersion,glslVersion);
  std::__cxx11::string::operator=((string *)(frag.field_2._M_local_buf + 8),(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  generateBasicFragmentSrc_abi_cxx11_(&local_f0,(glcts *)(ulong)this->m_glslVersion,glslVersion_00);
  std::__cxx11::string::operator=((string *)&value,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&progVF.m_program.m_info.linkTimeUs,this_00,
             (BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&progVF.m_program.m_info.linkTimeUs,
                       (char (*) [30])"Begin:PipelineApiCase iterate");
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&progVF.m_program.m_info.linkTimeUs);
  pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  pcVar13 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,pcVar13,&local_431);
  pcVar13 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,pcVar13,(allocator<char> *)((long)&i_1 + 3));
  glu::makeVtxFragSources(&local_410,&local_430,(string *)&i);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_340,pRVar12,&local_410);
  glu::ProgramSources::~ProgramSources(&local_410);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 3));
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  p_Var1 = gl_00->programParameteri;
  dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_340);
  (*p_Var1)(dVar9,0x8258,1);
  p_Var2 = gl_00->linkProgram;
  dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_340);
  (*p_Var2)(dVar9);
  p_Var3 = gl_00->getProgramiv;
  dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_340);
  (*p_Var3)(dVar9,0x8b82,&local_9c);
  if (local_9c != 1) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"LinkProgram failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x3a3);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->genProgramPipelines)(1,(GLuint *)(vtx.field_2._M_local_buf + 8));
  uVar6 = vtx.field_2._8_4_;
  p_Var4 = gl_00->activeShaderProgram;
  dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_340);
  (*p_Var4)(uVar6,dVar9);
  GVar10 = (*gl_00->getError)();
  glu::checkError(GVar10,"ActiveShaderProgram failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x3aa);
  uVar6 = vtx.field_2._8_4_;
  p_Var4 = gl_00->activeShaderProgram;
  dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_340);
  (*p_Var4)(uVar6,dVar9 + 100);
  GVar10 = (*gl_00->getError)();
  if (GVar10 != 0x501) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"ActiveShaderProgram failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x3b3);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->getProgramPipelineiv)(vtx.field_2._8_4_,0x8259,(GLint *)&local_a0);
  dVar9 = local_a0;
  dVar11 = glu::ShaderProgram::getProgram((ShaderProgram *)local_340);
  if (dVar9 != dVar11) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"ActiveShaderProgram failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x3b8);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->deleteProgramPipelines)(1,(GLuint *)(vtx.field_2._M_local_buf + 8));
  uVar6 = vtx.field_2._8_4_;
  p_Var4 = gl_00->activeShaderProgram;
  dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_340);
  (*p_Var4)(uVar6,dVar9);
  GVar10 = (*gl_00->getError)();
  if (GVar10 != 0x502) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"ActiveShaderProgram failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x3c1);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->genProgramPipelines)(2,(GLuint *)(vtx.field_2._M_local_buf + 8));
  (*gl_00->genProgramPipelines)(3,pipelines);
  (*gl_00->genProgramPipelines)(5,pipelines + 3);
  for (i_2 = 0; i_2 < 10; i_2 = i_2 + 1) {
    (*gl_00->bindProgramPipeline)(pipelines[(long)i_2 + -2]);
    GVar7 = (*gl_00->isProgramPipeline)(pipelines[(long)i_2 + -2]);
    if (GVar7 == '\0') {
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar14,"GenProgramPipelines failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x3cf);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  (*gl_00->deleteProgramPipelines)(10,(GLuint *)(vtx.field_2._M_local_buf + 8));
  (*gl_00->genProgramPipelines)(2,(GLuint *)(vtx.field_2._M_local_buf + 8));
  (*gl_00->bindProgramPipeline)(vtx.field_2._8_4_);
  (*gl_00->getIntegerv)(0x825a,(GLint *)&local_a0);
  if (local_a0 != vtx.field_2._8_4_) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"BindProgramPipeline failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x3db);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->bindProgramPipeline)(vtx.field_2._12_4_);
  (*gl_00->getIntegerv)(0x825a,(GLint *)&local_a0);
  if (local_a0 != vtx.field_2._12_4_) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"BindProgramPipeline failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x3e1);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  GVar10 = (*gl_00->getError)();
  glu::checkError(GVar10,"BindProgramPipeline failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x3e3);
  (*gl_00->bindProgramPipeline)(pipelines[0]);
  (*gl_00->getIntegerv)(0x825a,(GLint *)&local_a0);
  GVar10 = (*gl_00->getError)();
  if ((GVar10 != 0x502) || (local_a0 != vtx.field_2._12_4_)) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"BindProgramPipeline failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x3ec);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->genProgramPipelines)(8,pipelines);
  (*gl_00->deleteProgramPipelines)(2,pipelines + 6);
  (*gl_00->deleteProgramPipelines)(3,pipelines + 3);
  pipelines[7] = 0;
  (*gl_00->deleteProgramPipelines)(10,(GLuint *)(vtx.field_2._M_local_buf + 8));
  (*gl_00->deleteProgramPipelines)(0,(GLuint *)(vtx.field_2._M_local_buf + 8));
  GVar10 = (*gl_00->getError)();
  glu::checkError(GVar10,"DeleteProgramPipelines failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x3f7);
  for (programSep = 0; (int)programSep < 10; programSep = programSep + 1) {
    GVar7 = (*gl_00->isProgramPipeline)(pipelines[(long)(int)programSep + -2]);
    if (GVar7 != '\0') {
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar14,"DeleteProgramPipelines failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x3fc);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  (*gl_00->getIntegerv)(0x825a,(GLint *)&local_a0);
  if (local_a0 != 0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"DeleteProgramPipelines failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x402);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  vtx.field_2._12_4_ = 0x1000;
  pipelines[0] = pipelines[0] + 100;
  for (separable = 0; separable < 3; separable = separable + 1) {
    GVar7 = (*gl_00->isProgramPipeline)(pipelines[(long)separable + -2]);
    if (GVar7 != '\0') {
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar14,"IsProgramPipeline failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x40e);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  (*gl_00->genProgramPipelines)(1,(GLuint *)(vtx.field_2._M_local_buf + 8));
  GVar7 = (*gl_00->isProgramPipeline)(vtx.field_2._8_4_);
  if (GVar7 != '\0') {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"IsProgramPipeline failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x414);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->deleteProgramPipelines)(1,(GLuint *)(vtx.field_2._M_local_buf + 8));
  GVar10 = (*gl_00->getError)();
  glu::checkError(GVar10,"IsProgramPipeline failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x417);
  local_46c = (*gl_00->createProgram)();
  (*gl_00->programParameteri)(local_46c,0x8258,1);
  (*gl_00->getProgramiv)(local_46c,0x8258,&local_470);
  if (local_470 != 0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"programParameteri PROGRAM_SEPARABLE failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x426);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->programParameteri)(local_46c,0x8258,0);
  (*gl_00->getProgramiv)(local_46c,0x8258,&local_470);
  if (local_470 != 0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"programParameteri PROGRAM_SEPARABLE failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x42c);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->deleteProgram)(local_46c);
  (*gl_00->programParameteri)(local_46c,0x8258,1);
  GVar10 = (*gl_00->getError)();
  if (GVar10 != 0x501) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"programParameteri PROGRAM_SEPARABLE failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x436);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  p_Var1 = gl_00->programParameteri;
  dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_340);
  (*p_Var1)(dVar9,0x8258,0x1f5);
  GVar10 = (*gl_00->getError)();
  if (GVar10 != 0x501) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"programParameteri PROGRAM_SEPARABLE failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x43c);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->genProgramPipelines)(1,(GLuint *)(vtx.field_2._M_local_buf + 8));
  (*gl_00->getProgramPipelineiv)(vtx.field_2._8_4_,0x8259,(GLint *)&local_a0);
  if (local_a0 != 0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"GetProgramPipelineiv failed for ACTIVE_PROGRAM",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x445);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->getProgramPipelineiv)(vtx.field_2._8_4_,0x8b31,(GLint *)&local_a0);
  if (local_a0 != 0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"GetProgramPipelineiv failed for VERTEX_SHADER",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x44a);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->getProgramPipelineiv)(vtx.field_2._8_4_,0x8b30,(GLint *)&local_a0);
  if (local_a0 != 0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"GetProgramPipelineiv failed for FRAGMENT_SHADER",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x44f);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->getProgramPipelineiv)(vtx.field_2._8_4_,0x8b83,(GLint *)&local_a0);
  if (local_a0 != 0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"GetProgramPipelineiv failed for VALIDATE_STATUS",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x454);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->getProgramPipelineiv)(vtx.field_2._8_4_,0x8b84,(GLint *)&local_a0);
  if (local_a0 != 0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"GetProgramPipelineiv failed for INFO_LOG_LENGTH",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x459);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  GVar10 = (*gl_00->getError)();
  glu::checkError(GVar10,"GetProgramPipelineiv failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x45b);
  (*gl_00->deleteProgramPipelines)(1,(GLuint *)(vtx.field_2._M_local_buf + 8));
  (*gl_00->getProgramPipelineiv)(vtx.field_2._8_4_,0x8259,(GLint *)&local_a0);
  GVar10 = (*gl_00->getError)();
  if (GVar10 != 0x502) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"GetProgramPipelineiv failed for ACTIVE_PROGRAM",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x464);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->genProgramPipelines)(1,(GLuint *)(vtx.field_2._M_local_buf + 8));
  (*gl_00->getProgramPipelineiv)(vtx.field_2._8_4_,0x8b83,(GLint *)&local_a0);
  if (local_a0 != 0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"ValidateProgramPipeline failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x46d);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->validateProgramPipeline)(vtx.field_2._8_4_);
  (*gl_00->getProgramPipelineiv)(vtx.field_2._8_4_,0x8b83,(GLint *)&local_a0);
  if (local_a0 != 0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"ValidateProgramPipeline failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x474);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*gl_00->bindProgramPipeline)(vtx.field_2._8_4_);
  (*gl_00->validateProgramPipeline)(vtx.field_2._8_4_);
  (*gl_00->getProgramPipelineiv)(vtx.field_2._8_4_,0x8b83,(GLint *)&local_a0);
  uVar6 = vtx.field_2._8_4_;
  if (local_a0 != 0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"ValidateProgramPipeline failed with empty program pipeline",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x47d);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  p_Var5 = gl_00->useProgramStages;
  dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_340);
  (*p_Var5)(uVar6,3,dVar9);
  (*gl_00->validateProgramPipeline)(vtx.field_2._8_4_);
  (*gl_00->getProgramPipelineiv)(vtx.field_2._8_4_,0x8b83,(GLint *)&local_a0);
  if (local_a0 != 1) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"ValidateProgramPipeline failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x485);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  checkProgInfoLog(this,gl_00,vtx.field_2._8_4_);
  p_Var1 = gl_00->programParameteri;
  dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_340);
  (*p_Var1)(dVar9,0x8258,0);
  p_Var2 = gl_00->linkProgram;
  dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_340);
  (*p_Var2)(dVar9);
  (*gl_00->getError)();
  (*gl_00->validateProgramPipeline)(vtx.field_2._8_4_);
  (*gl_00->getProgramPipelineiv)(vtx.field_2._8_4_,0x8b83,(GLint *)&local_a0);
  if (local_a0 != 0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"ValidateProgramPipeline failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x494);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  GVar10 = (*gl_00->getError)();
  glu::checkError(GVar10,"ValidateProgramPipeline failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x496);
  checkProgInfoLog(this,gl_00,vtx.field_2._8_4_);
  (*gl_00->deleteProgramPipelines)(1,(GLuint *)(vtx.field_2._M_local_buf + 8));
  (*gl_00->validateProgramPipeline)(vtx.field_2._8_4_);
  GVar10 = (*gl_00->getError)();
  if (GVar10 != 0x502) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"ValidateProgramPipeline failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x4a2);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_340);
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)(frag.field_2._M_local_buf + 8));
  return STOP;
}

Assistant:

IterateResult iterate(void)
	{
		TestLog&			  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		glw::GLenum			  err;
		const int			  maxpipelines = 10;
		glw::GLuint			  pipelines[maxpipelines];
		std::string			  vtx;
		std::string			  frag;
		glw::GLint			  linkStatus;
		glw::GLuint			  value;

		vtx  = generateBasicVertexSrc(m_glslVersion);
		frag = generateBasicFragmentSrc(m_glslVersion);

		// Pipeline API verification
		log << TestLog::Message << "Begin:PipelineApiCase iterate" << TestLog::EndMessage;

		glu::ShaderProgram progVF(m_context.getRenderContext(), glu::makeVtxFragSources(vtx.c_str(), frag.c_str()));

		// Make separable and relink
		gl.programParameteri(progVF.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.linkProgram(progVF.getProgram());
		gl.getProgramiv(progVF.getProgram(), GL_LINK_STATUS, &linkStatus);
		if (linkStatus != 1)
		{
			TCU_FAIL("LinkProgram failed");
		}

		gl.genProgramPipelines(1, pipelines);

		// ActiveShaderProgram
		gl.activeShaderProgram(pipelines[0], progVF.getProgram());
		GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveShaderProgram failed");

		// Negative cases for ActiveShaderProgram

		// Nonexistent program
		gl.activeShaderProgram(pipelines[0], progVF.getProgram() + 100);
		err = gl.getError();
		if (err != GL_INVALID_VALUE)
		{
			TCU_FAIL("ActiveShaderProgram failed");
		}
		gl.getProgramPipelineiv(pipelines[0], GL_ACTIVE_PROGRAM, (glw::GLint*)&value);
		if (value != progVF.getProgram())
		{
			TCU_FAIL("ActiveShaderProgram failed");
		}

		// Deleted pipeline
		gl.deleteProgramPipelines(1, pipelines);
		gl.activeShaderProgram(pipelines[0], progVF.getProgram());
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("ActiveShaderProgram failed");
		}

		// GenProgramPipeline

		gl.genProgramPipelines(2, &pipelines[0]);
		gl.genProgramPipelines(3, &pipelines[2]);
		gl.genProgramPipelines(5, &pipelines[5]);

		for (int i = 0; i < maxpipelines; i++)
		{
			gl.bindProgramPipeline(pipelines[i]); // has to be bound to be recognized
			if (!gl.isProgramPipeline(pipelines[i]))
			{
				TCU_FAIL("GenProgramPipelines failed");
			}
		}
		gl.deleteProgramPipelines(maxpipelines, pipelines);

		// BindProgramPipeline

		gl.genProgramPipelines(2, pipelines);
		gl.bindProgramPipeline(pipelines[0]);
		gl.getIntegerv(GL_PROGRAM_PIPELINE_BINDING, (glw::GLint*)&value);
		if (value != pipelines[0])
		{
			TCU_FAIL("BindProgramPipeline failed");
		}
		gl.bindProgramPipeline(pipelines[1]);
		gl.getIntegerv(GL_PROGRAM_PIPELINE_BINDING, (glw::GLint*)&value);
		if (value != pipelines[1])
		{
			TCU_FAIL("BindProgramPipeline failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindProgramPipeline failed");

		// Negative Case for BindProgramPipeline

		gl.bindProgramPipeline(pipelines[2]); // deleted pipeline
		gl.getIntegerv(GL_PROGRAM_PIPELINE_BINDING, (glw::GLint*)&value);
		err = gl.getError();
		if ((err != GL_INVALID_OPERATION) || (value != pipelines[1]))
		{
			TCU_FAIL("BindProgramPipeline failed");
		}

		// DeleteProgramPipelines

		gl.genProgramPipelines(8, &pipelines[2]); // back to 10 total
		gl.deleteProgramPipelines(2, &pipelines[8]);
		gl.deleteProgramPipelines(3, &pipelines[5]);
		pipelines[9] = 0;
		gl.deleteProgramPipelines(maxpipelines, pipelines); // 5 good, 4 deleted, 1 zero
		gl.deleteProgramPipelines(0, pipelines);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DeleteProgramPipelines failed");
		for (int i = 0; i < maxpipelines; i++)
		{
			if (gl.isProgramPipeline(pipelines[i]))
			{
				TCU_FAIL("DeleteProgramPipelines failed");
			}
		}
		gl.getIntegerv(GL_PROGRAM_PIPELINE_BINDING, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("DeleteProgramPipelines failed");
		}

		// IsProgramPipeline

		pipelines[1] = 0x1000;
		pipelines[2] += 100;
		for (int i = 0; i < 3; i++)
		{
			// 1 deleted and 2 bogus values
			if (gl.isProgramPipeline(pipelines[i]))
			{
				TCU_FAIL("IsProgramPipeline failed");
			}
		}
		gl.genProgramPipelines(1, pipelines);
		if (gl.isProgramPipeline(pipelines[0]))
		{
			TCU_FAIL("IsProgramPipeline failed");
		}
		gl.deleteProgramPipelines(1, pipelines);
		GLU_EXPECT_NO_ERROR(gl.getError(), "IsProgramPipeline failed");

		// ProgramParameteri PROGRAM_SEPARABLE
		// NOTE: The query for PROGRAM_SEPARABLE must query latched
		//       state. In other words, the state of the binary after
		//       it was linked. So in the tests below, the queries
		//       should return the default state GL_FALSE since the
		//       program has no linked binary.

		glw::GLuint programSep = gl.createProgram();
		int			separable;
		gl.programParameteri(programSep, GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.getProgramiv(programSep, GL_PROGRAM_SEPARABLE, &separable);
		if (separable != GL_FALSE)
		{
			TCU_FAIL("programParameteri PROGRAM_SEPARABLE failed");
		}
		gl.programParameteri(programSep, GL_PROGRAM_SEPARABLE, GL_FALSE);
		gl.getProgramiv(programSep, GL_PROGRAM_SEPARABLE, &separable);
		if (separable != 0)
		{
			TCU_FAIL("programParameteri PROGRAM_SEPARABLE failed");
		}

		// Negative Case for ProgramParameteri PROGRAM_SEPARABLE

		gl.deleteProgram(programSep);
		gl.programParameteri(programSep, GL_PROGRAM_SEPARABLE, GL_TRUE);
		err = gl.getError();
		if (err != GL_INVALID_VALUE)
		{
			TCU_FAIL("programParameteri PROGRAM_SEPARABLE failed");
		}
		gl.programParameteri(progVF.getProgram(), GL_PROGRAM_SEPARABLE, 501);
		err = gl.getError();
		if (err != GL_INVALID_VALUE)
		{
			TCU_FAIL("programParameteri PROGRAM_SEPARABLE failed");
		}

		// GetProgramPipelineiv

		gl.genProgramPipelines(1, pipelines);
		gl.getProgramPipelineiv(pipelines[0], GL_ACTIVE_PROGRAM, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("GetProgramPipelineiv failed for ACTIVE_PROGRAM");
		}
		gl.getProgramPipelineiv(pipelines[0], GL_VERTEX_SHADER, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("GetProgramPipelineiv failed for VERTEX_SHADER");
		}
		gl.getProgramPipelineiv(pipelines[0], GL_FRAGMENT_SHADER, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("GetProgramPipelineiv failed for FRAGMENT_SHADER");
		}
		gl.getProgramPipelineiv(pipelines[0], GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("GetProgramPipelineiv failed for VALIDATE_STATUS");
		}
		gl.getProgramPipelineiv(pipelines[0], GL_INFO_LOG_LENGTH, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("GetProgramPipelineiv failed for INFO_LOG_LENGTH");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramPipelineiv failed");

		// Negative Case for GetProgramPipelineiv

		gl.deleteProgramPipelines(1, pipelines);
		gl.getProgramPipelineiv(pipelines[0], GL_ACTIVE_PROGRAM, (glw::GLint*)&value);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("GetProgramPipelineiv failed for ACTIVE_PROGRAM");
		}

		// ValidateProgramPipeline

		gl.genProgramPipelines(1, pipelines); // Unvalidated
		gl.getProgramPipelineiv(pipelines[0], GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("ValidateProgramPipeline failed");
		}

		gl.validateProgramPipeline(pipelines[0]); // Not bound yet
		gl.getProgramPipelineiv(pipelines[0], GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("ValidateProgramPipeline failed");
		}

		gl.bindProgramPipeline(pipelines[0]);

		gl.validateProgramPipeline(pipelines[0]); // Still empty program pipeline.
		gl.getProgramPipelineiv(pipelines[0], GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("ValidateProgramPipeline failed with empty program pipeline");
		}

		gl.useProgramStages(pipelines[0], GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT, progVF.getProgram());
		gl.validateProgramPipeline(pipelines[0]);
		gl.getProgramPipelineiv(pipelines[0], GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 1)
		{
			TCU_FAIL("ValidateProgramPipeline failed");
		}

		// GetProgramPipelineInfoLog
		checkProgInfoLog(gl, pipelines[0]);

		// ValidateProgramPipeline additional
		// Relink the bound separable program as not separable
		gl.programParameteri(progVF.getProgram(), GL_PROGRAM_SEPARABLE, GL_FALSE);
		gl.linkProgram(progVF.getProgram());
		err = gl.getError();
		gl.validateProgramPipeline(pipelines[0]);
		gl.getProgramPipelineiv(pipelines[0], GL_VALIDATE_STATUS, (glw::GLint*)&value);
		if (value != 0)
		{
			TCU_FAIL("ValidateProgramPipeline failed");
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "ValidateProgramPipeline failed");

		// GetProgramPipelineInfoLog
		checkProgInfoLog(gl, pipelines[0]);

		// Negative Case for ValidateProgramPipeline

		gl.deleteProgramPipelines(1, pipelines);
		gl.validateProgramPipeline(pipelines[0]);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("ValidateProgramPipeline failed");
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}